

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteGenError(unqlite *pDb,char *zErr)

{
  sxu32 nSize;
  sxi32 sVar1;
  
  nSize = SyStrlen(zErr);
  SyBlobAppend(&pDb->sErr,zErr,nSize);
  sVar1 = SyBlobAppend(&pDb->sErr,"\n",1);
  return sVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteGenError(unqlite *pDb,const char *zErr)
{
	int rc;
	/* Append the error message */
	rc = SyBlobAppend(&pDb->sErr,(const void *)zErr,SyStrlen(zErr));
	/* Append a new line */
	SyBlobAppend(&pDb->sErr,(const void *)"\n",sizeof(char));
	return rc;
}